

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O0

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddSelect
          (InstructionBuilder *this,uint32_t type,uint32_t cond,uint32_t true_value,
          uint32_t false_value)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  initializer_list<spvtools::opt::Operand> __l;
  uint32_t res_id;
  Instruction *pIVar1;
  IRContext *c;
  IRContext *this_00;
  Operand *local_1a8;
  allocator<spvtools::opt::Operand> local_19d;
  uint32_t local_19c;
  iterator local_198;
  undefined8 local_190;
  SmallVector<unsigned_int,_2UL> local_188;
  uint32_t local_15c;
  iterator local_158;
  undefined8 local_150;
  SmallVector<unsigned_int,_2UL> local_148;
  uint32_t local_11c;
  iterator local_118;
  undefined8 local_110;
  SmallVector<unsigned_int,_2UL> local_108;
  Operand local_e0;
  Operand OStack_b0;
  Operand OStack_80;
  iterator local_50;
  _func_int **local_48;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_40;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_28;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> select;
  uint32_t false_value_local;
  uint32_t true_value_local;
  uint32_t cond_local;
  uint32_t type_local;
  InstructionBuilder *this_local;
  
  select._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._0_4_ = false_value;
  select._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ = true_value;
  pIVar1 = (Instruction *)::operator_new(0x70);
  c = GetContext(this);
  this_00 = GetContext(this);
  res_id = IRContext::TakeNextId(this_00);
  local_118 = &local_11c;
  local_110 = 1;
  init_list_01._M_len = 1;
  init_list_01._M_array = local_118;
  local_11c = cond;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_108,init_list_01);
  Operand::Operand(&local_e0,SPV_OPERAND_TYPE_ID,&local_108);
  local_15c = select._M_t.
              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_;
  local_158 = &local_15c;
  local_150 = 1;
  init_list_00._M_len = 1;
  init_list_00._M_array = local_158;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_148,init_list_00);
  Operand::Operand(&OStack_b0,SPV_OPERAND_TYPE_ID,&local_148);
  local_19c = (uint32_t)
              select._M_t.
              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  local_198 = &local_19c;
  local_190 = 1;
  init_list._M_len = 1;
  init_list._M_array = local_198;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_188,init_list);
  Operand::Operand(&OStack_80,SPV_OPERAND_TYPE_ID,&local_188);
  local_50 = &local_e0;
  local_48 = (_func_int **)0x3;
  std::allocator<spvtools::opt::Operand>::allocator(&local_19d);
  __l._M_len = (size_type)local_48;
  __l._M_array = local_50;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            (&local_40,__l,&local_19d);
  opt::Instruction::Instruction(pIVar1,c,OpSelect,type,res_id,&local_40);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_28,pIVar1);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_40);
  std::allocator<spvtools::opt::Operand>::~allocator(&local_19d);
  local_1a8 = (Operand *)&local_50;
  do {
    local_1a8 = local_1a8 + -1;
    Operand::~Operand(local_1a8);
  } while (local_1a8 != &local_e0);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_188);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_148);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_108);
  pIVar1 = AddInstruction(this,&local_28);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_28);
  return pIVar1;
}

Assistant:

Instruction* AddSelect(uint32_t type, uint32_t cond, uint32_t true_value,
                         uint32_t false_value) {
    // TODO(1841): Handle id overflow.
    std::unique_ptr<Instruction> select(new Instruction(
        GetContext(), spv::Op::OpSelect, type, GetContext()->TakeNextId(),
        std::initializer_list<Operand>{{SPV_OPERAND_TYPE_ID, {cond}},
                                       {SPV_OPERAND_TYPE_ID, {true_value}},
                                       {SPV_OPERAND_TYPE_ID, {false_value}}}));
    return AddInstruction(std::move(select));
  }